

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O3

void __thiscall QTableView::columnResized(QTableView *this,int column,int param_2,int param_3)

{
  long lVar1;
  long in_FS_OFFSET;
  int local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  local_24 = column;
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            ((QPodArrayOps<int> *)(lVar1 + 0x550),*(qsizetype *)(lVar1 + 0x560),&local_24);
  QList<int>::end((QList<int> *)(lVar1 + 0x550));
  if (*(int *)(lVar1 + 0x548) == 0) {
    QBasicTimer::start(lVar1 + 0x548,0,1,this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableView::columnResized(int column, int, int)
{
    Q_D(QTableView);
    d->columnsToUpdate.append(column);
    if (!d->columnResizeTimer.isActive())
        d->columnResizeTimer.start(0ns, this);
}